

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int decode_key_share_entry(uint16_t *group,ptls_iovec_t *key_exchange,uint8_t **src,uint8_t *end)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = ptls_decode16(group,src,end);
  if (iVar4 == 0) {
    puVar3 = *src;
    iVar4 = 0x32;
    if (1 < (ulong)((long)end - (long)puVar3)) {
      *src = puVar3 + 1;
      uVar2 = *puVar3;
      puVar1 = puVar3 + 2;
      *src = puVar1;
      uVar5 = (ulong)CONCAT11(uVar2,puVar3[1]);
      if (uVar5 <= (ulong)((long)end - (long)puVar1)) {
        key_exchange->base = puVar1;
        key_exchange->len = uVar5;
        *src = puVar1 + uVar5;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int decode_key_share_entry(uint16_t *group, ptls_iovec_t *key_exchange, const uint8_t **src, const uint8_t *const end)
{
    int ret;

    if ((ret = ptls_decode16(group, src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(*src, end, 2, {
        *key_exchange = ptls_iovec_init(*src, end - *src);
        *src = end;
    });

Exit:
    return ret;
}